

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnopZero<unsigned_int,double>
          (Thread *this,UnopFunc<unsigned_int,_double> *f)

{
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  uint uVar1;
  double *pdVar2;
  uint *puVar3;
  byte local_3a;
  byte local_39;
  undefined1 auStack_38 [6];
  u8 i_1;
  u8 i;
  SR result;
  Simd<double,_(unsigned_char)__x02_> val;
  UnopFunc<unsigned_int,_double> *f_local;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  for (local_39 = 0; local_39 < 2; local_39 = local_39 + 1) {
    pdVar2 = Simd<double,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<double,_(unsigned_char)__x02_> *)(result.v + 2),local_39);
    uVar1 = (*f)(*pdVar2);
    puVar3 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)auStack_38,local_39);
    *puVar3 = uVar1;
  }
  for (local_3a = 2; local_3a < 4; local_3a = local_3a + 1) {
    puVar3 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)auStack_38,local_3a);
    *puVar3 = 0;
  }
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = auStack_38._0_4_;
  value.v[1] = stack0xffffffffffffffcc;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnopZero(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  for (u8 i = 0; i < ST::lanes; ++i) {
    result[i] = f(val[i]);
  }
  for (u8 i = ST::lanes; i < SR::lanes; ++i) {
    result[i] = 0;
  }
  Push(result);
  return RunResult::Ok;
}